

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

string * __thiscall UniValue::get_str_abi_cxx11_(UniValue *this)

{
  runtime_error *this_00;
  string *psVar1;
  UniValue *this_local;
  
  if (this->typ != VSTR) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON value is not a string as expected");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar1 = getValStr_abi_cxx11_(this);
  return psVar1;
}

Assistant:

const std::string& UniValue::get_str() const
{
    if (typ != VSTR)
        throw std::runtime_error("JSON value is not a string as expected");
    return getValStr();
}